

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O3

void nni_sha1_init(nni_sha1_ctx *ctx)

{
  ctx->len = 0;
  ctx->idx = 0;
  ctx->digest[0] = 0x67452301;
  ctx->digest[1] = 0xefcdab89;
  ctx->digest[2] = 0x98badcfe;
  ctx->digest[3] = 0x10325476;
  ctx->digest[4] = 0xc3d2e1f0;
  return;
}

Assistant:

void
nni_sha1_init(nni_sha1_ctx *ctx)
{
	ctx->len = 0;
	ctx->idx = 0;

	ctx->digest[0] = 0x67452301;
	ctx->digest[1] = 0xEFCDAB89;
	ctx->digest[2] = 0x98BADCFE;
	ctx->digest[3] = 0x10325476;
	ctx->digest[4] = 0xC3D2E1F0;
}